

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O3

LY_ERR yin_parse_identity(lysp_yin_ctx *ctx,lysp_ident **identities)

{
  lysp_ident *plVar1;
  lysp_ext_instance *object;
  LY_ERR LVar2;
  long *plVar3;
  long lVar4;
  lysp_ext_instance **exts;
  yin_subelement subelems [6];
  yin_subelement local_b8;
  undefined4 local_a0;
  long *local_98;
  undefined2 local_90;
  undefined4 local_88;
  long *local_80;
  undefined2 local_78;
  undefined4 local_70;
  long *local_68;
  undefined2 local_60;
  undefined4 local_58;
  long *local_50;
  undefined2 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  
  plVar1 = *identities;
  if (plVar1 == (lysp_ident *)0x0) {
    plVar3 = (long *)malloc(0x40);
    if (plVar3 == (long *)0x0) goto LAB_001855b4;
    *plVar3 = 1;
    lVar4 = 1;
  }
  else {
    lVar4 = *(long *)&plVar1[-1].flags;
    *(long *)&plVar1[-1].flags = lVar4 + 1;
    plVar3 = (long *)realloc(&plVar1[-1].flags,lVar4 * 0x38 + 0x40);
    if (plVar3 == (long *)0x0) {
      *(long *)&(*identities)[-1].flags = *(long *)&(*identities)[-1].flags + -1;
LAB_001855b4:
      ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "yin_parse_identity");
      return LY_EMEM;
    }
    lVar4 = *plVar3;
  }
  *identities = (lysp_ident *)(plVar3 + 1);
  plVar3[lVar4 * 7 + -2] = 0;
  (plVar3 + lVar4 * 7 + -2)[1] = 0;
  plVar3[lVar4 * 7 + -4] = 0;
  (plVar3 + lVar4 * 7 + -4)[1] = 0;
  plVar3[lVar4 * 7 + -6] = 0;
  (plVar3 + lVar4 * 7 + -6)[1] = 0;
  plVar3[lVar4 * 7] = 0;
  LVar2 = lyxml_ctx_next(ctx->xmlctx);
  if (LVar2 == LY_SUCCESS) {
    LVar2 = yin_parse_attribute(ctx,YIN_ARG_NAME,(char **)(plVar3 + lVar4 * 7 + -6),Y_IDENTIF_ARG,
                                LY_STMT_IDENTITY);
    if (LVar2 == LY_SUCCESS) {
      local_50 = plVar3 + lVar4 * 7;
      local_b8.type = LY_STMT_BASE;
      local_b8.dest = local_50 + -4;
      local_b8.flags = 0;
      local_a0 = 0x80000;
      local_98 = local_50 + -3;
      local_90 = 2;
      local_88 = 0x130000;
      local_80 = local_50 + -5;
      local_78 = 8;
      local_70 = 0x270000;
      local_68 = local_50 + -2;
      local_60 = 2;
      local_58 = 0x2c0000;
      local_48 = 2;
      uStack_38 = 0;
      local_30 = 0;
      local_40 = 0xf0000;
      exts = (lysp_ext_instance **)(local_50 + -1);
      LVar2 = yin_parse_content(ctx,&local_b8,6,plVar3 + lVar4 * 7 + -6,LY_STMT_IDENTITY,
                                (char **)0x0,exts);
      if (LVar2 == LY_SUCCESS) {
        object = *exts;
        if (object != (lysp_ext_instance *)0x0) {
          LVar2 = ly_set_add(&ctx->main_ctx->ext_inst,object,'\x01',(uint32_t *)0x0);
          if (LVar2 != LY_SUCCESS) {
            return LVar2 + (LVar2 == LY_SUCCESS);
          }
        }
        LVar2 = LY_SUCCESS;
      }
    }
  }
  return LVar2;
}

Assistant:

static LY_ERR
yin_parse_identity(struct lysp_yin_ctx *ctx, struct lysp_ident **identities)
{
    struct lysp_ident *ident;

    /* allocate new identity */
    LY_ARRAY_NEW_RET(ctx->xmlctx->ctx, *identities, ident, LY_EMEM);

    /* parse argument */
    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_NAME, &ident->name, Y_IDENTIF_ARG, LY_STMT_IDENTITY));

    /* parse content */
    struct yin_subelement subelems[] = {
        {LY_STMT_BASE, &ident->bases, 0},
        {LY_STMT_DESCRIPTION, &ident->dsc, YIN_SUBELEM_UNIQUE},
        {LY_STMT_IF_FEATURE, &ident->iffeatures, YIN_SUBELEM_VER2},
        {LY_STMT_REFERENCE, &ident->ref, YIN_SUBELEM_UNIQUE},
        {LY_STMT_STATUS, &ident->flags, YIN_SUBELEM_UNIQUE},
        {LY_STMT_EXTENSION_INSTANCE, NULL, 0},
    };

    LY_CHECK_RET(yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), ident, LY_STMT_IDENTITY, NULL, &ident->exts));

    /* store extension instance array (no realloc anymore) to find the plugin records and finish parsing */
    LY_CHECK_RET(yin_unres_exts_add(ctx, ident->exts));

    return LY_SUCCESS;
}